

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::SearchSmallAndLarge(PageHeap *this,uint64_t n)

{
  bool bVar1;
  Span *pSVar2;
  ulong uVar3;
  Span *unaff_R15;
  bool bVar4;
  
  bVar4 = 0x7f < n;
  if (n < 0x80) {
    pSVar2 = this->small_returned_ + n;
    uVar3 = n;
    do {
      if (pSVar2 + -0x80 != pSVar2[-0x80].prev) {
        unaff_R15 = pSVar2[-0x80].next;
        RemoveFromFreeList(this,unaff_R15);
        bVar1 = CheckSmallList(this);
        if (!bVar1) {
          __assert_fail("CheckSmallList()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                        ,0xa7,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
        }
        break;
      }
      if (pSVar2 != pSVar2->prev) {
        unaff_R15 = pSVar2->next;
        RemoveFromFreeList(this,unaff_R15);
        bVar1 = CheckSmallList(this);
        if (!bVar1) {
          __assert_fail("CheckSmallList()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                        ,0xae,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
        }
        break;
      }
      bVar4 = 0x7e < uVar3;
      uVar3 = uVar3 + 1;
      pSVar2 = pSVar2 + 1;
    } while (uVar3 != 0x80);
  }
  if (!bVar4) {
    return unaff_R15;
  }
  pSVar2 = AllocLarge(this,n);
  return pSVar2;
}

Assistant:

Span* SearchSmallAndLarge(uint64_t n) {
        Span* span = nullptr;
        for (uint64_t i = n; i <= spanSmallPages; ++i) {
            if (!ListEmpty(&small_normal_[i])) {
                span = small_normal_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }

            if (!ListEmpty(&small_returned_[i])) {
                span = small_returned_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }
        }
        return AllocLarge(n);
    }